

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject_test_app.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Container *pCVar3;
  type waterConsumers;
  type walkers;
  type runners;
  Container c;
  type flyers;
  type swimmers;
  type crawlers;
  type jumpers;
  shared_ptr<WaterPool> waterPool;
  shared_ptr<IFlyer> flyer;
  shared_ptr<ISwimmer> swimmer;
  shared_ptr<ICrawler> crawler;
  shared_ptr<IJumper> jumper;
  shared_ptr<IRunner> runner;
  shared_ptr<IWalker> walter;
  shared_ptr<IWaterConsumer> instance_6;
  undefined1 local_210 [24];
  undefined1 local_1f8 [24];
  type local_1e0;
  undefined1 local_1c8 [64];
  type local_188;
  type local_170;
  type local_158;
  type local_140;
  __shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2> local_128;
  undefined1 local_118 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2> local_a8;
  ComponentBuilderBase<WaterPool> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  ComponentBuilderBase<Behavior> local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  ComponentBuilderBase<Wings> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  ComponentBuilderBase<Arms> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ComponentBuilderBase<Legs> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_1c8._0_8_ = (Container *)0x0;
  local_1c8._8_8_ = local_1c8 + 0x38;
  local_1c8._16_8_ = (pointer)0x1;
  local_1c8._24_8_ = (pointer)0x0;
  local_1c8._32_8_ = 0;
  local_1c8._40_4_ = 1.0;
  local_1c8._48_8_ = 0;
  local_1c8._56_8_ = (__node_base_ptr)0x0;
  local_1e0.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8;
  cinject::
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>::
  to<Human>((ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>
             *)local_1f8);
  *(code *)(local_1f8._0_8_ + 9) = (code)0x1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  local_1e0.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8;
  cinject::ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake>::to<Snake>
            ((ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake> *)local_1f8);
  *(code *)(local_1f8._0_8_ + 9) = (code)0x1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  local_1e0.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8;
  cinject::ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle>::to<Turtle>
            ((ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle> *)local_1f8)
  ;
  *(code *)(local_1f8._0_8_ + 9) = (code)0x1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  local_1e0.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8;
  cinject::ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird>::to<Bird>
            ((ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird> *)
             local_1f8);
  *(code *)(local_1f8._0_8_ + 9) = (code)0x1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  local_1f8._0_8_ = (Container *)local_1c8;
  cinject::ComponentBuilderBase<Legs>::to<Legs>(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  local_1f8._0_8_ = (Container *)local_1c8;
  cinject::ComponentBuilderBase<Arms>::to<Arms>(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  local_1f8._0_8_ = (Container *)local_1c8;
  cinject::ComponentBuilderBase<Wings>::to<Wings>(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<std::shared_ptr<Behavior>_(cinject::InjectionContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mjirous[P]cinject/src/sample/cinject_test_app.cpp:228:45)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<std::shared_ptr<Behavior>_(cinject::InjectionContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mjirous[P]cinject/src/sample/cinject_test_app.cpp:228:45)>
             ::_M_manager;
  local_1f8._0_8_ = (Container *)local_1c8;
  cinject::ComponentBuilderBase<Behavior>::toFunction<Behavior>
            (&local_88,(FactoryMethodType *)local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  local_1f8._0_4_ = 1000;
  std::make_shared<WaterPool,int>((int *)&local_128);
  local_1f8._0_8_ = (Container *)local_1c8;
  std::__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a8,&local_128);
  cinject::ComponentBuilderBase<WaterPool>::toConstant<WaterPool>
            (&local_98,(shared_ptr<WaterPool> *)local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving IWalker");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<IWalker>((Container *)(local_d8 + 0x10),(InjectionContext *)local_1c8);
  (*(code *)**(undefined8 **)local_d8._16_8_)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving IRunner");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<IRunner>((Container *)local_d8,(InjectionContext *)local_1c8);
  (*(code *)(*(Container **)local_d8._0_8_)->parentContainer_)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving IJumper");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<IJumper>((Container *)(local_f8 + 0x10),(InjectionContext *)local_1c8);
  (*(code *)**(undefined8 **)local_f8._16_8_)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving ICrawler");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<ICrawler>((Container *)local_f8,(InjectionContext *)local_1c8);
  (*(code *)(*(Container **)local_f8._0_8_)->parentContainer_)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving ISwimmer");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<ISwimmer>((Container *)(local_118 + 0x10),(InjectionContext *)local_1c8);
  (*(code *)**(undefined8 **)local_118._16_8_)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving IFlyer");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<IFlyer>((Container *)local_118,(InjectionContext *)local_1c8);
  (*(code *)(*(Container **)local_118._0_8_)->parentContainer_)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IWalker");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<IWalker,std::allocator<IWalker>>>
            ((type *)local_1f8,(Container *)local_1c8,(InjectionContext *)0x0);
  for (pCVar3 = (Container *)local_1f8._0_8_; pCVar3 != (Container *)local_1f8._8_8_;
      pCVar3 = (Container *)&(pCVar3->registrations_)._M_h._M_bucket_count) {
    std::__shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2> *)&local_1e0,
               (__shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2> *)pCVar3);
    (*(code *)(*(Container **)
                &(local_1e0.
                  super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>)->parentContainer_)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_1e0.
                super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IRunner");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<IRunner,std::allocator<IRunner>>>
            (&local_1e0,(Container *)local_1c8,(InjectionContext *)0x0);
  for (pCVar3 = (Container *)
                local_1e0.
                super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar3 != (Container *)
                local_1e0.
                super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pCVar3 = (Container *)&(pCVar3->registrations_)._M_h._M_bucket_count) {
    std::__shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2> *)&local_140,
               (__shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2> *)pCVar3);
    (*(code *)(((local_140.
                 super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_IJumper)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_140.
                super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IJumper");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<IJumper,std::allocator<IJumper>>>
            (&local_140,(Container *)local_1c8,(InjectionContext *)0x0);
  for (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.
                super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.
                super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2> *)&local_158,
               (__shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2> *)p_Var2);
    (*(code *)(((local_158.
                 super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ICrawler)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_158.
                super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of ICrawler");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<ICrawler,std::allocator<ICrawler>>>
            (&local_158,(Container *)local_1c8,(InjectionContext *)0x0);
  for (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_158.
                super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_158.
                super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2> *)&local_170,
               (__shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2> *)p_Var2);
    (*(code *)(((local_170.
                 super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ISwimmer)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_170.
                super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of ISwimmer");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<ISwimmer,std::allocator<ISwimmer>>>
            (&local_170,(Container *)local_1c8,(InjectionContext *)0x0);
  for (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_170.
                super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_170.
                super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2> *)&local_188,
               (__shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2> *)p_Var2);
    (*(code *)(((local_188.
                 super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_IFlyer)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_188.
                super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IFlyer");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<IFlyer,std::allocator<IFlyer>>>
            (&local_188,(Container *)local_1c8,(InjectionContext *)0x0);
  for (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_188.
                super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_188.
                super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2> *)local_210,
               (__shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2> *)p_Var2);
    (*(code *)(*(Container **)local_210._0_8_)->parentContainer_)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Dumping all entity behavior");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<Human>((Container *)local_210,(InjectionContext *)local_1c8);
  Behavior::act((Behavior *)
                (((Container *)(local_210._0_8_ + 0x40))->registrations_)._M_h._M_bucket_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Snake>((Container *)local_210,(InjectionContext *)local_1c8);
  Behavior::act((Behavior *)
                (((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                   *)(local_210._0_8_ + 8))->_M_h)._M_element_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Turtle>((Container *)local_210,(InjectionContext *)local_1c8);
  Behavior::act((Behavior *)
                (((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                   *)(local_210._0_8_ + 8))->_M_h)._M_rehash_policy._M_next_resize);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Bird>((Container *)local_210,(InjectionContext *)local_1c8);
  Behavior::act((Behavior *)
                (((Container *)(local_210._0_8_ + 0x40))->registrations_)._M_h._M_buckets);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  poVar1 = std::operator<<((ostream *)&std::cout,"Moving with all limbs");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<Human>((Container *)local_210,(InjectionContext *)local_1c8);
  Legs::move((Legs *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                        *)(local_210._0_8_ + 8))->_M_h)._M_rehash_policy._M_next_resize);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Human>((Container *)local_210,(InjectionContext *)local_1c8);
  Arms::move((Arms *)((Container *)(local_210._0_8_ + 0x40))->parentContainer_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Snake>((Container *)local_210,(InjectionContext *)local_1c8);
  Legs::move((Legs *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                        *)(local_210._0_8_ + 8))->_M_h)._M_bucket_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Turtle>((Container *)local_210,(InjectionContext *)local_1c8);
  Legs::move((Legs *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                        *)(local_210._0_8_ + 8))->_M_h)._M_element_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Bird>((Container *)local_210,(InjectionContext *)local_1c8);
  Legs::move(*(Legs **)&(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                           *)(local_210._0_8_ + 8))->_M_h)._M_rehash_policy);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  cinject::Container::get<Bird>((Container *)local_210,(InjectionContext *)local_1c8);
  Wings::move((Wings *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                          *)(local_210._0_8_ + 8))->_M_h)._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  poVar1 = std::operator<<((ostream *)&std::cout,"Make all entities consume water");
  std::endl<char,std::char_traits<char>>(poVar1);
  cinject::Container::get<std::vector<IWaterConsumer,std::allocator<IWaterConsumer>>>
            ((type *)local_210,(Container *)local_1c8,(InjectionContext *)0x0);
  for (pCVar3 = (Container *)local_210._0_8_; pCVar3 != (Container *)local_210._8_8_;
      pCVar3 = (Container *)&(pCVar3->registrations_)._M_h._M_bucket_count) {
    std::__shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,(__shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2> *)pCVar3);
    (**(local_b8._M_ptr)->_vptr_IWaterConsumer)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Remaining water in water pool: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(local_128._M_ptr)->capacity_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>::
  ~vector((vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
           *)local_210);
  std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>::~vector
            (&local_188);
  std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>::~vector
            (&local_170);
  std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>::~vector
            (&local_158);
  std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>::~vector
            (&local_140);
  std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>::~vector
            (&local_1e0);
  std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>::~vector
            ((vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_> *)
             local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  std::
  _Hashtable<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1c8 + 8));
  return 0;
}

Assistant:

int main()
{
    Container c;

    // Singletons
    c.bind<IWalker, IRunner, IJumper, ICrawler, ISwimmer, IWaterConsumer, Human>().to<Human>().inSingletonScope();
    c.bind<ICrawler, IWaterConsumer, Snake>().to<Snake>().inSingletonScope();
    c.bind<IWalker, ICrawler, ISwimmer, IWaterConsumer, Turtle>().to<Turtle>().inSingletonScope();
    c.bind<IWalker, IRunner, IJumper, IFlyer, IWaterConsumer, Bird>().to<Bird>().inSingletonScope();

    // Not singletons
    c.bind<Legs>().toSelf();
    c.bind<Arms>().toSelf();
    c.bind<Wings>().to<Wings>(); //Same as toSelf

    // Manual creation of object. Not singleton, but it could be by calling InSingleTonScope
    c.bind<Behavior>().toFunction<Behavior>([](InjectionContext* ctx)
    {
        const std::string name = ctx->getRequester().name();
        return std::make_shared<Behavior>(name);
    });

    // Manually created instance
    auto waterPool = std::make_shared<WaterPool>(1000);
    c.bind<WaterPool>().toConstant(waterPool);


    std::cout << "Resolving IWalker" << std::endl;
    std::shared_ptr<IWalker> walter = c.get<IWalker>();
    walter->walk();

    std::cout << "Resolving IRunner" << std::endl;
    std::shared_ptr<IRunner> runner = c.get<IRunner>();
    runner->run();

    std::cout << "Resolving IJumper" << std::endl;
    std::shared_ptr<IJumper> jumper = c.get<IJumper>();
    jumper->jump();

    std::cout << "Resolving ICrawler" << std::endl;
    std::shared_ptr<ICrawler> crawler = c.get<ICrawler>();
    crawler->crawl();

    std::cout << "Resolving ISwimmer" << std::endl;
    std::shared_ptr<ISwimmer> swimmer = c.get<ISwimmer>();
    swimmer->swim();

    std::cout << "Resolving IFlyer" << std::endl;
    std::shared_ptr<IFlyer> flyer = c.get<IFlyer>();
    flyer->fly();




    std::cout << "Resolving all implementations of IWalker" << std::endl;
    auto walkers = c.get<std::vector<IWalker>>();

    for (std::shared_ptr<IWalker> instance : walkers)
    {
        instance->walk();
    }

    std::cout << "Resolving all implementations of IRunner" << std::endl;
    auto runners = c.get<std::vector<IRunner>>();

    for (std::shared_ptr<IRunner> instance : runners)
    {
        instance->run();
    }

    std::cout << "Resolving all implementations of IJumper" << std::endl;
    auto jumpers = c.get<std::vector<IJumper>>();

    for (std::shared_ptr<IJumper> instance : jumpers)
    {
        instance->jump();
    }

    std::cout << "Resolving all implementations of ICrawler" << std::endl;
    auto crawlers = c.get<std::vector<ICrawler>>();

    for (std::shared_ptr<ICrawler> instance : crawlers)
    {
        instance->crawl();
    }

    std::cout << "Resolving all implementations of ISwimmer" << std::endl;
    auto swimmers = c.get<std::vector<ISwimmer>>();

    for (std::shared_ptr<ISwimmer> instance : swimmers)
    {
        instance->swim();
    }

    std::cout << "Resolving all implementations of IFlyer" << std::endl;
    auto flyers = c.get<std::vector<IFlyer>>();

    for (std::shared_ptr<IFlyer> instance : flyers)
    {
        instance->fly();
    }


    std::cout << "Dumping all entity behavior" << std::endl;
    c.get<Human>()->behavior->act();
    c.get<Snake>()->behavior->act();
    c.get<Turtle>()->behavior->act();
    c.get<Bird>()->behavior->act();

    std::cout << "Moving with all limbs" << std::endl;
    c.get<Human>()->legs->move();
    c.get<Human>()->arms->move();
    c.get<Snake>()->legs->move();
    c.get<Turtle>()->legs->move();
    c.get<Bird>()->legs->move();
    c.get<Bird>()->wings->move();


    std::cout << "Make all entities consume water" << std::endl;
    auto waterConsumers = c.get<std::vector<IWaterConsumer>>();

    for (std::shared_ptr<IWaterConsumer> instance : waterConsumers)
    {
        instance->consumeWater();
    }

    std::cout << "Remaining water in water pool: " << waterPool->remainingWater() << std::endl;

    return 0;
}